

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

uint64_t Catch::getEstimatedClockResolution(void)

{
  int iVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  undefined8 in_RSI;
  ulong uVar6;
  
  if ((getEstimatedClockResolution()::s_resolution == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getEstimatedClockResolution()::s_resolution), iVar1 != 0)) {
    lVar2 = std::chrono::_V2::system_clock::now();
    uVar6 = 0;
    uVar5 = 0;
    do {
      if (uVar6 == 1000000) {
        getEstimatedClockResolution::s_resolution = uVar5 / 1000000;
        uVar5 = uVar5 % 1000000;
        goto LAB_0019ea62;
      }
      lVar3 = std::chrono::_V2::system_clock::now();
      do {
        uVar4 = std::chrono::_V2::system_clock::now();
      } while (uVar4 - lVar3 == 0);
      uVar5 = uVar5 + (uVar4 - lVar3);
      uVar6 = uVar6 + 1;
    } while (uVar4 <= lVar2 + 3000000000U);
    getEstimatedClockResolution::s_resolution = uVar5 / uVar6;
    uVar5 = uVar5 % uVar6;
LAB_0019ea62:
    __cxa_guard_release(&getEstimatedClockResolution()::s_resolution,in_RSI,uVar5);
  }
  return getEstimatedClockResolution::s_resolution;
}

Assistant:

auto getEstimatedClockResolution() -> uint64_t {
        static auto s_resolution = estimateClockResolution();
        return s_resolution;
    }